

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O3

bool wallet::feebumper::SignTransaction(CWallet *wallet,CMutableTransaction *mtx)

{
  long lVar1;
  bool bVar2;
  optional<common::PSBTError> oVar3;
  long in_FS_OFFSET;
  bool complete;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  PartiallySignedTransaction psbtx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock3.super_unique_lock._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  criticalblock3.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock3.super_unique_lock);
  bVar2 = CWallet::IsWalletFlagSet(wallet,0x800000000);
  if (bVar2) {
    PartiallySignedTransaction::PartiallySignedTransaction(&psbtx,mtx);
    CWallet::FillPSBT(wallet,&psbtx,&complete,1,false,true,(size_t *)0x0,true);
    oVar3 = CWallet::FillPSBT(wallet,&psbtx,&complete,1,true,false,(size_t *)0x0,true);
    if (((ulong)oVar3.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
                super__Optional_payload_base<common::PSBTError> >> 0x20 & 1) == 0) {
      bVar2 = FinalizeAndExtractPSBT(&psbtx,mtx);
    }
    else {
      bVar2 = false;
    }
    std::
    _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
    ::~_Rb_tree(&psbtx.m_proprietary._M_t);
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&psbtx.unknown._M_t);
    std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&psbtx.outputs);
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&psbtx.inputs);
    std::
    _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
    ::~_Rb_tree(&psbtx.m_xpubs._M_t);
    std::_Optional_payload_base<CMutableTransaction>::_M_reset
              ((_Optional_payload_base<CMutableTransaction> *)&psbtx);
  }
  else {
    bVar2 = CWallet::SignTransaction(wallet,mtx);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SignTransaction(CWallet& wallet, CMutableTransaction& mtx) {
    LOCK(wallet.cs_wallet);

    if (wallet.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        // Make a blank psbt
        PartiallySignedTransaction psbtx(mtx);

        // First fill transaction with our data without signing,
        // so external signers are not asked to sign more than once.
        bool complete;
        wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, false /* sign */, true /* bip32derivs */);
        auto err{wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true /* sign */, false  /* bip32derivs */)};
        if (err) return false;
        complete = FinalizeAndExtractPSBT(psbtx, mtx);
        return complete;
    } else {
        return wallet.SignTransaction(mtx);
    }
}